

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

char32_t convertCase_helper<char32_t>(char32_t uc,Case which)

{
  long lVar1;
  short sVar2;
  Properties *pPVar3;
  long lVar4;
  uint in_ESI;
  char32_t in_EDI;
  long in_FS_OFFSET;
  ushort *specialCase;
  anon_struct_2_2_b36fdad7 fold;
  char32_t local_24;
  char32_t local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar3 = QUnicodeTables::qGetProp(in_EDI);
  sVar2 = (short)pPVar3->cases[in_ESI] >> 1;
  if (((ushort)pPVar3->cases[in_ESI] & 1) == 0) {
    local_10 = in_EDI + sVar2;
  }
  else {
    lVar4 = (long)(int)sVar2 * 2;
    local_24 = in_EDI;
    if (*(short *)(QUnicodeTables::specialCaseMap + lVar4) == 1) {
      local_24 = (char32_t)*(ushort *)(QUnicodeTables::specialCaseMap + lVar4 + 2);
    }
    local_10 = local_24;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

Q_DECL_CONST_FUNCTION static inline T convertCase_helper(T uc, QUnicodeTables::Case which) noexcept
{
    const auto fold = qGetProp(uc)->cases[which];

    if (Q_UNLIKELY(fold.special)) {
        const ushort *specialCase = specialCaseMap + fold.diff;
        // so far, there are no special cases beyond BMP (guaranteed by the qunicodetables generator)
        return *specialCase == 1 ? specialCase[1] : uc;
    }

    return uc + fold.diff;
}